

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O3

void __thiscall
QCss::StyleSelector::matchRule
          (StyleSelector *this,NodePtr node,StyleRule *rule,StyleSheetOrigin origin,int depth,
          QMultiMap<unsigned_int,_QCss::StyleRule> *weightedRules)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  QArrayDataPointer<QCss::BasicSelector> *this_00;
  ulong uVar4;
  QArrayDataPointer<QCss::BasicSelector> *other;
  long lVar5;
  long in_FS_OFFSET;
  uint weight;
  uint local_74;
  StyleRule local_70;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((rule->selectors).d.size != 0) {
    lVar5 = 0;
    uVar4 = 0;
    do {
      other = (QArrayDataPointer<QCss::BasicSelector> *)
              ((long)&(((rule->selectors).d.ptr)->basicSelectors).d.d + lVar5);
      bVar2 = selectorMatches(this,(Selector *)other,node);
      if (bVar2) {
        iVar1 = rule->order;
        iVar3 = Selector::specificity((Selector *)other);
        local_74 = iVar3 * 0x100 + iVar1 + (depth + origin) * 0x100000;
        local_70.selectors.d.d = (rule->selectors).d.d;
        local_70.selectors.d.ptr = (rule->selectors).d.ptr;
        local_70.selectors.d.size = (rule->selectors).d.size;
        if (local_70.selectors.d.d != (Data *)0x0) {
          LOCK();
          ((local_70.selectors.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_70.selectors.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + 1;
          UNLOCK();
        }
        local_70.declarations.d.d = (rule->declarations).d.d;
        local_70.declarations.d.ptr = (rule->declarations).d.ptr;
        local_70.declarations.d.size = (rule->declarations).d.size;
        if (local_70.declarations.d.d != (Data *)0x0) {
          LOCK();
          ((local_70.declarations.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
          _M_i = ((local_70.declarations.d.d)->super_QArrayData).ref_._q_value.
                 super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        local_70._52_4_ = 0xaaaaaaaa;
        local_70.order = rule->order;
        if (1 < (ulong)(rule->selectors).d.size) {
          QList<QCss::Selector>::resize(&local_70.selectors,1);
          this_00 = (QArrayDataPointer<QCss::BasicSelector> *)
                    QList<QCss::Selector>::data(&local_70.selectors);
          QArrayDataPointer<QCss::BasicSelector>::operator=(this_00,other);
        }
        QMultiMap<unsigned_int,_QCss::StyleRule>::insert(weightedRules,&local_74,&local_70);
        QArrayDataPointer<QCss::Declaration>::~QArrayDataPointer(&local_70.declarations.d);
        QArrayDataPointer<QCss::Selector>::~QArrayDataPointer
                  ((QArrayDataPointer<QCss::Selector> *)&local_70);
      }
      uVar4 = uVar4 + 1;
      lVar5 = lVar5 + 0x18;
    } while (uVar4 < (ulong)(rule->selectors).d.size);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void StyleSelector::matchRule(NodePtr node, const StyleRule &rule, StyleSheetOrigin origin,
                               int depth, QMultiMap<uint, StyleRule> *weightedRules)
{
    for (int j = 0; j < rule.selectors.size(); ++j) {
        const Selector& selector = rule.selectors.at(j);
        if (selectorMatches(selector, node)) {
            uint weight = rule.order
                        + selector.specificity() *0x100
                        + (uint(origin) + depth)*0x100000;
            StyleRule newRule = rule;
            if (rule.selectors.size() > 1) {
                newRule.selectors.resize(1);
                newRule.selectors[0] = selector;
            }
            //We might have rules with the same weight if they came from a rule with several selectors
            weightedRules->insert(weight, newRule);
        }
    }
}